

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O1

IAnimatedMesh * __thiscall irr::scene::CSceneManager::getMesh(CSceneManager *this,IReadFile *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  IAnimatedMesh *pIVar3;
  path name;
  path local_40;
  
  if (file == (IReadFile *)0x0) {
    pIVar3 = (IAnimatedMesh *)0x0;
  }
  else {
    iVar2 = (*file->_vptr_IReadFile[4])(file);
    paVar1 = &local_40.str.field_2;
    local_40.str._M_string_length = 0;
    local_40.str.field_2._M_local_buf[0] = '\0';
    local_40.str._M_dataplus._M_p = (pointer)paVar1;
    if (&local_40 != (path *)CONCAT44(extraout_var,iVar2)) {
      ::std::__cxx11::string::_M_assign((string *)&local_40);
    }
    iVar2 = (*this->MeshCache->_vptr_IMeshCache[7])(this->MeshCache,&local_40);
    pIVar3 = (IAnimatedMesh *)CONCAT44(extraout_var_00,iVar2);
    if (pIVar3 == (IAnimatedMesh *)0x0) {
      pIVar3 = getUncachedMesh(this,file,&local_40,&local_40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.str._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.str._M_dataplus._M_p,
                      CONCAT71(local_40.str.field_2._M_allocated_capacity._1_7_,
                               local_40.str.field_2._M_local_buf[0]) + 1);
    }
  }
  return pIVar3;
}

Assistant:

IAnimatedMesh *CSceneManager::getMesh(io::IReadFile *file)
{
	if (!file)
		return 0;

	io::path name = file->getFileName();
	IAnimatedMesh *msh = MeshCache->getMeshByName(name);
	if (msh)
		return msh;

	msh = getUncachedMesh(file, name, name);

	return msh;
}